

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DatatypeValidator::setTypeName(DatatypeValidator *this,XMLCh *name,XMLCh *uri)

{
  int iVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  XMLCh *__dest;
  
  if (this->fTypeName != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    this->fTypeName = (XMLCh *)0x0;
  }
  if (name == (XMLCh *)0x0 && uri == (XMLCh *)0x0) {
    this->fTypeLocalName = L"";
    this->fTypeUri = L"";
  }
  else {
    XVar2 = XMLString::stringLen(name);
    XVar3 = XMLString::stringLen(uri);
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(XVar3 + XVar2) * 2 + 4);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar1);
    this->fTypeName = __dest;
    this->fTypeUri = __dest;
    this->fTypeLocalName = __dest + XVar3 + 1;
    if (uri == (XMLCh *)0x0) {
      *__dest = L'\0';
    }
    else {
      memmove(__dest,uri,(XVar3 + 1) * 2);
    }
    if (name != (XMLCh *)0x0) {
      memmove(this->fTypeName + XVar3 + 1,name,XVar2 * 2 + 2);
      return;
    }
    this->fTypeName[XVar3 + 1] = L'\0';
  }
  return;
}

Assistant:

void DatatypeValidator::setTypeName(const XMLCh* const name, const XMLCh* const uri)
{
    if (fTypeName) {

        fMemoryManager->deallocate(fTypeName);
        fTypeName = 0;
    }

    if (name || uri) {

        XMLSize_t nameLen = XMLString::stringLen(name);
        XMLSize_t uriLen = XMLString::stringLen(uri);

        fTypeName = (XMLCh*) fMemoryManager->allocate
        (
            (nameLen + uriLen + 2)*sizeof(XMLCh)
        );
        fTypeUri = fTypeName;
        fTypeLocalName = &fTypeName[uriLen+1];

        if (uri)
			XMLString::moveChars(fTypeName, uri, uriLen+1);
        else
			fTypeName[0] = chNull;

        if (name)
            XMLString::moveChars(&fTypeName[uriLen+1], name, nameLen+1);
        else
            fTypeName[uriLen+1] = chNull;
    }
    else
    {
        fTypeUri = fTypeLocalName = XMLUni::fgZeroLenString;
    }
}